

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-kalman-filter.hxx
# Opt level: O2

StateVector * __thiscall
stateObservation::compileTime::KalmanFilter<4U,_3U,_2U>::prediction_
          (StateVector *__return_storage_ptr__,KalmanFilter<4U,_3U,_2U> *this,uint k)

{
  reference this_00;
  long lVar1;
  MatrixT *pMVar2;
  double *pdVar3;
  byte bVar4;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double *local_110;
  double *local_108;
  double *local_100;
  undefined1 *local_f8;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8 [16];
  
  bVar4 = 0;
  IndexedMatrix<4U,_4U>::check_(&(this->super_KalmanFilterBase<4U,_3U,_2U>).a_);
  local_110 = local_a8;
  pMVar2 = &(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_;
  pdVar3 = local_110;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar3 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
              m_data.array[0];
    pMVar2 = (MatrixT *)((long)pMVar2 + (ulong)bVar4 * -0x10 + 8);
    pdVar3 = pdVar3 + (ulong)bVar4 * -2 + 1;
  }
  IndexedMatrix<4U,_1U>::check_
            (&(this->super_KalmanFilterBase<4U,_3U,_2U>).super_ZeroDelayObserver<4U,_3U,_2U>.x_);
  local_138 = (this->super_KalmanFilterBase<4U,_3U,_2U>).super_ZeroDelayObserver<4U,_3U,_2U>.x_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
  ;
  dStack_130 = *(double *)
                ((long)&(this->super_KalmanFilterBase<4U,_3U,_2U>).
                        super_ZeroDelayObserver<4U,_3U,_2U>.x_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data + 8);
  local_128 = *(double *)
               ((long)&(this->super_KalmanFilterBase<4U,_3U,_2U>).
                       super_ZeroDelayObserver<4U,_3U,_2U>.x_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
               + 0x10);
  dStack_120 = *(double *)
                ((long)&(this->super_KalmanFilterBase<4U,_3U,_2U>).
                        super_ZeroDelayObserver<4U,_3U,_2U>.x_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data + 0x18);
  IndexedMatrix<4U,_2U>::check_(&this->b_);
  local_e8 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
             m_data.array[0];
  dStack_e0 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
              m_data.array[1];
  local_d8 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
             m_data.array[2];
  dStack_d0 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
              m_data.array[3];
  local_c8 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
             m_data.array[4];
  dStack_c0 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
              m_data.array[5];
  local_b8 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
             m_data.array[6];
  dStack_b0 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
              m_data.array[7];
  this_00 = std::
            _Deque_iterator<stateObservation::compileTime::IndexedMatrix<2U,_1U>,_stateObservation::compileTime::IndexedMatrix<2U,_1U>_&,_stateObservation::compileTime::IndexedMatrix<2U,_1U>_*>
            ::operator[](&(this->super_KalmanFilterBase<4U,_3U,_2U>).
                          super_ZeroDelayObserver<4U,_3U,_2U>.u_.
                          super__Deque_base<stateObservation::compileTime::IndexedMatrix<2U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<2U,_1U>_>_>
                          ._M_impl.super__Deque_impl_data._M_start,0);
  IndexedMatrix<2U,_1U>::check_(this_00);
  local_148 = (this_00->v_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
              m_data.array[0];
  dStack_140 = (this_00->v_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
               m_data.array[1];
  local_108 = &local_138;
  local_100 = &local_e8;
  local_f8 = (undefined1 *)&local_148;
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,0>const,Eigen::Product<Eigen::Matrix<double,4,2,0,4,2>,Eigen::Matrix<double,2,1,0,2,1>,0>const>>
            ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_4,_2,_0,_4,_2>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>_>_>
              *)&local_110);
  return __return_storage_ptr__;
}

Assistant:

typename ObserverBase<n,m,p>::StateVector KalmanFilter<n,m,p>::prediction_(unsigned k)
{
    (void)k; //unused

    if (p>0)
        return this->a_()*this->x_()+this->b_()*this->u_[0]();
    else
        return typename ObserverBase<n,m,p>::StateVector(this->a_()*this->x_());

}